

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

IntSet * __thiscall
OSTEI_VRR_Algorithm_Base::GetIntReq_2q
          (IntSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *__x;
  
  cVar2 = std::
          _Rb_tree<QAM,_std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(this->qamint_2q_)._M_t,am);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->qamint_2q_)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
    ;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  else {
    __x = &std::
           map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::at(&this->qamint_2q_,am)->_M_t;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&__return_storage_ptr__->_M_t,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

IntSet OSTEI_VRR_Algorithm_Base::GetIntReq_2q(QAM am) const
{
    if(qamint_2q_.count(am) == 0)
        return IntSet();
    else
        return qamint_2q_.at(am);
}